

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Complex.cpp
# Opt level: O3

void __thiscall Complex::buyOption(Complex *this,EuropeanPut *option)

{
  double dVar1;
  EuropeanPut local_38;
  
  local_38.super_PathIndependentOption.super_Option.multiplier =
       (option->super_PathIndependentOption).super_Option.multiplier;
  local_38.super_PathIndependentOption.super_Option.K =
       (option->super_PathIndependentOption).super_Option.K;
  local_38.super_PathIndependentOption.super_Option.T =
       (option->super_PathIndependentOption).super_Option.T;
  local_38.super_PathIndependentOption.pathDependent =
       (option->super_PathIndependentOption).pathDependent;
  local_38.super_PathIndependentOption.super_Option._vptr_Option = (_func_int **)&PTR_print_00115950
  ;
  std::vector<EuropeanPut,_std::allocator<EuropeanPut>_>::emplace_back<EuropeanPut>
            (&this->european_put,&local_38);
  EuropeanPut::~EuropeanPut(&local_38);
  dVar1 = Option::getMaturity((Option *)option);
  if (dVar1 <= this->max_T) {
    dVar1 = this->max_T;
  }
  this->max_T = dVar1;
  return;
}

Assistant:

void Complex::buyOption(EuropeanPut const& option)
{
	european_put.push_back(EuropeanPut(option));
	max_T = std::max(max_T, option.getMaturity());
}